

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O2

bool __thiscall ON_BrepVertex::Read(ON_BrepVertex *this,ON_BinaryArchive *file)

{
  bool bVar1;
  
  bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_vertex_index);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::ReadPoint(file,&(this->super_ON_Point).point);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::ReadArray(file,&this->m_ei);
      if (bVar1) {
        bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_tolerance);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool
ON_BrepVertex::Read( ON_BinaryArchive& file )
{
  bool rc = file.ReadInt( &m_vertex_index );
  if ( rc )
    rc = file.ReadPoint( point );
  if ( rc )
    rc = file.ReadArray( m_ei );
  if ( rc )
    rc = file.ReadDouble( &m_tolerance );
  return rc;
}